

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgviz.hpp
# Opt level: O2

imgviz * __thiscall
imgviz::tile(imgviz *this,vector<cv::Mat,_std::allocator<cv::Mat>_> *images,Vec2i *shape,
            uint border_width,Scalar *border_color)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  pointer pMVar4;
  ulong uVar5;
  Scalar *pSVar6;
  long lVar7;
  uint local_2f4;
  uint local_2f0;
  _InputArray local_2e0;
  long local_2c8;
  _InputArray local_2c0;
  long local_2a8;
  Scalar *local_2a0;
  ulong local_298;
  long local_290;
  long local_288;
  ulong local_280;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *local_278;
  ulong local_270;
  _OutputArray local_268;
  Mat image;
  Mat border;
  uint uStack_1ec;
  Mat dst_row;
  int local_88;
  
  pMVar4 = (images->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_2f0 = *(uint *)(pMVar4 + 8);
  local_2f4 = *(uint *)(pMVar4 + 0xc);
  uVar3 = ((long)(images->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar4) / 0x60;
  pMVar4 = pMVar4 + 0x6c;
  pSVar6 = border_color;
  for (uVar5 = 1; uVar5 < uVar3; uVar5 = uVar5 + 1) {
    if (local_2f0 < *(uint *)(pMVar4 + -4)) {
      local_2f0 = *(uint *)(pMVar4 + -4);
    }
    pSVar6 = (Scalar *)(ulong)local_2f0;
    if (local_2f4 < *(uint *)pMVar4) {
      local_2f4 = *(uint *)pMVar4;
    }
    pMVar4 = pMVar4 + 0x60;
  }
  uVar1 = (shape->super_Matx<int,_2,_1>).val[0];
  local_280 = (ulong)uVar1;
  uVar2 = (shape->super_Matx<int,_2,_1>).val[1];
  local_298 = (ulong)uVar2;
  local_2a0 = border_color;
  local_278 = images;
  if (uVar2 * uVar1 == 0) {
    getTileShape((imgviz *)&border,(uint)uVar3,(double)local_2f0 / (double)local_2f4);
    local_280 = CONCAT44(uStack_1ec,_border);
    *(ulong *)(shape->super_Matx<int,_2,_1>).val = local_280;
    local_298 = (ulong)uStack_1ec;
  }
  cv::Mat::Mat((Mat *)this);
  local_280 = local_280 & 0xffffffff;
  local_288 = local_298 * 0x60;
  local_2c8 = 0;
  lVar7 = 0;
  uVar5 = 0;
  do {
    if (uVar5 == local_280) {
      return this;
    }
    cv::Mat::Mat(&dst_row);
    local_2a8 = lVar7;
    local_290 = lVar7;
    local_270 = uVar5;
    for (uVar3 = 0; uVar5 = local_270, local_298 != uVar3; uVar3 = uVar3 + 1) {
      uVar5 = local_2c8 + uVar3;
      cv::Mat::Mat(&image);
      pMVar4 = (local_278->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (uVar5 < (ulong)(((long)(local_278->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4) / 0x60))
      {
        cv::Mat::operator=(&image,pMVar4 + local_290);
        local_2e0.flags = local_2f4;
        local_2e0._4_4_ = local_2f0;
        centerize((imgviz *)&border,&image,(Size *)&local_2e0);
        cv::Mat::operator=(&image,&border);
        cv::Mat::~Mat(&border);
      }
      else {
        cv::Mat::zeros((int)(_InputArray *)&border,local_2f0,local_2f4);
        (**(code **)(*(long *)CONCAT44(uStack_1ec,_border) + 0x18))
                  ((long *)CONCAT44(uStack_1ec,_border),(_InputArray *)&border,&image);
        cv::MatExpr::~MatExpr((MatExpr *)&border);
      }
      if ((_image & 0xfff) == 0) {
        local_2e0.sz.width = 0;
        local_2e0.sz.height = 0;
        _border = 0x1010000;
        local_2e0.flags = 0x2010000;
        local_2e0.obj = &image;
        cv::cvtColor((cv *)&border,&local_2e0,(_OutputArray *)0x8,0,(int)pSVar6);
      }
      if ((_image & 0xfff) != 0x10) {
        __assert_fail("image.type() == CV_8UC3",
                      "/workspace/llm4binary/github/license_c_cmakelists/wkentaro[P]imgviz-cpp/include/imgviz.hpp"
                      ,0xa8,
                      "cv::Mat imgviz::tile(const std::vector<cv::Mat>, cv::Vec2i, const unsigned int, const cv::Scalar)"
                     );
      }
      if (uVar3 == 0) {
        cv::Mat::operator=(&dst_row,&image);
      }
      else {
        if (border_width != 0) {
          cv::Mat::Mat(&border,local_88,border_width,0x10);
          local_2e0.flags = -0x3efdfffa;
          local_2e0.obj = local_2a0;
          local_2e0.sz.width = 1;
          local_2e0.sz.height = 4;
          cv::noArray();
          cv::Mat::setTo((_InputArray *)&border,&local_2e0);
          local_2e0.sz.width = 0;
          local_2e0.sz.height = 0;
          local_2e0.flags = 0x1010000;
          local_2c0.sz.width = 0;
          local_2c0.sz.height = 0;
          local_268.super__InputArray.sz.width = 0;
          local_268.super__InputArray.sz.height = 0;
          local_2c0.flags = 0x1010000;
          local_268.super__InputArray.flags = 0x2010000;
          local_2e0.obj = &dst_row;
          local_2c0.obj = (_InputArray *)&border;
          local_268.super__InputArray.obj = &dst_row;
          cv::hconcat(&local_2e0,&local_2c0,&local_268);
          cv::Mat::~Mat(&border);
        }
        _border = 0x1010000;
        local_2e0.sz.width = 0;
        local_2e0.sz.height = 0;
        local_2c0.sz.width = 0;
        local_2c0.sz.height = 0;
        local_2e0.flags = 0x1010000;
        local_2c0.flags = 0x2010000;
        local_2e0.obj = &image;
        local_2c0.obj = &dst_row;
        cv::hconcat((_InputArray *)&border,&local_2e0,(_OutputArray *)&local_2c0);
      }
      cv::Mat::~Mat(&image);
      local_290 = local_290 + 0x60;
    }
    if (local_270 == 0) {
      cv::Mat::operator=((Mat *)this,&dst_row);
    }
    else {
      if (border_width != 0) {
        cv::Mat::Mat(&border,border_width,*(int *)(this + 0xc),0x10);
        _image = -0x3efdfffa;
        cv::noArray();
        cv::Mat::setTo((_InputArray *)&border,(_InputArray *)&image);
        _image = 0x1010000;
        local_2e0.sz.width = 0;
        local_2e0.sz.height = 0;
        local_2c0.sz.width = 0;
        local_2c0.sz.height = 0;
        local_2e0.flags = 0x1010000;
        local_2c0.flags = 0x2010000;
        local_2e0.obj = (_InputArray *)&border;
        local_2c0.obj = this;
        cv::vconcat((_InputArray *)&image,&local_2e0,(_OutputArray *)&local_2c0);
        cv::Mat::~Mat(&border);
      }
      _border = 0x1010000;
      local_2e0.sz.width = 0;
      local_2e0.sz.height = 0;
      _image = 0x1010000;
      local_2e0.flags = 0x2010000;
      local_2e0.obj = this;
      cv::vconcat((_InputArray *)&border,(_InputArray *)&image,(_OutputArray *)&local_2e0);
    }
    lVar7 = local_2a8;
    cv::Mat::~Mat(&dst_row);
    uVar5 = uVar5 + 1;
    lVar7 = lVar7 + local_288;
    local_2c8 = local_2c8 + local_298;
  } while( true );
}

Assistant:

cv::Mat tile(const std::vector<cv::Mat> images,
             cv::Vec2i shape = cv::Vec2i(0, 0), const unsigned border_width = 5,
             const cv::Scalar border_color = cv::Scalar(255, 255, 255)) {
  unsigned height = images[0].rows;
  unsigned width = images[0].cols;
  for (size_t i = 1; i < images.size(); i++) {
    if (images[i].rows > height) {
      height = images[i].rows;
    }
    if (images[i].cols > width) {
      width = images[i].cols;
    }
  }

  if (shape[0] * shape[1] == 0) {
    shape = getTileShape(/*size=*/images.size(),
                         /*hw_ratio=*/static_cast<double>(height) /
                             static_cast<double>(width));
  }
  unsigned rows = shape[0];
  unsigned cols = shape[1];

  cv::Mat dst;
  for (size_t j = 0; j < rows; j++) {
    cv::Mat dst_row;
    for (size_t i = 0; i < cols; i++) {
      size_t index = j * cols + i;

      cv::Mat image;
      if (index < images.size()) {
        image = images[index];
        image = centerize(image, cv::Size(width, height));
      } else {
        image = cv::Mat::zeros(height, width, images[0].type());
      }

      if (image.type() == CV_8UC1) {
        cv::cvtColor(image, image, cv::COLOR_GRAY2BGR);
      }
      assert(image.type() == CV_8UC3);

      if (i == 0) {
        dst_row = image;
      } else {
        if (border_width != 0) {
          cv::Mat border = cv::Mat(dst_row.rows, border_width, CV_8UC3);
          border.setTo(border_color);
          cv::hconcat(dst_row, border, dst_row);
        }
        cv::hconcat(dst_row, image, dst_row);
      }
    }
    if (j == 0) {
      dst = dst_row;
    } else {
      if (border_width != 0) {
        cv::Mat border = cv::Mat(border_width, dst.cols, CV_8UC3);
        border.setTo(border_color);
        cv::vconcat(dst, border, dst);
      }
      cv::vconcat(dst, dst_row, dst);
    }
  }

  return dst;
}